

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.c
# Opt level: O0

void Mig_ManStop(Mig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Mig_Obj_t *pMVar3;
  Mig_Man_t *p_local;
  
  if ((p->vTravIds).pArray != (int *)0x0) {
    free((p->vTravIds).pArray);
    (p->vTravIds).pArray = (int *)0x0;
  }
  if ((p->vCopies).pArray != (int *)0x0) {
    free((p->vCopies).pArray);
    (p->vCopies).pArray = (int *)0x0;
  }
  if ((p->vLevels).pArray != (int *)0x0) {
    free((p->vLevels).pArray);
    (p->vLevels).pArray = (int *)0x0;
  }
  if ((p->vRefs).pArray != (int *)0x0) {
    free((p->vRefs).pArray);
    (p->vRefs).pArray = (int *)0x0;
  }
  if ((p->vSibls).pArray != (int *)0x0) {
    free((p->vSibls).pArray);
    (p->vSibls).pArray = (int *)0x0;
  }
  p->iPage = 0;
  while (iVar1 = p->iPage, iVar2 = Vec_PtrSize(&p->vPages), iVar1 < iVar2) {
    pMVar3 = (Mig_Obj_t *)Vec_PtrEntry(&p->vPages,p->iPage);
    p->pPage = pMVar3;
    p->pPage = p->pPage + -1;
    if (p->pPage != (Mig_Obj_t *)0x0) {
      free(p->pPage);
      p->pPage = (Mig_Obj_t *)0x0;
    }
    p->iPage = p->iPage + 1;
  }
  if ((p->vPages).pArray != (void **)0x0) {
    free((p->vPages).pArray);
    (p->vPages).pArray = (void **)0x0;
  }
  if ((p->vCis).pArray != (int *)0x0) {
    free((p->vCis).pArray);
    (p->vCis).pArray = (int *)0x0;
  }
  if ((p->vCos).pArray != (int *)0x0) {
    free((p->vCos).pArray);
    (p->vCos).pArray = (int *)0x0;
  }
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p != (Mig_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Mig_ManStop( Mig_Man_t * p )
{
    if ( 0 )
    printf( "Subject graph uses %d pages of %d objects with %d entries. Total memory = %.2f MB.\n", 
        Vec_PtrSize(&p->vPages), MIG_MASK + 1, p->nObjs,
        1.0 * Vec_PtrSize(&p->vPages) * (MIG_MASK + 1) * 16 / (1 << 20) );
    // attributes
    ABC_FREE( p->vTravIds.pArray );
    ABC_FREE( p->vCopies.pArray );
    ABC_FREE( p->vLevels.pArray );
    ABC_FREE( p->vRefs.pArray );
    ABC_FREE( p->vSibls.pArray );
    // pages
    Vec_PtrForEachEntry( Mig_Obj_t *, &p->vPages, p->pPage, p->iPage )
        --p->pPage, ABC_FREE( p->pPage );
    // objects
    ABC_FREE( p->vPages.pArray );
    ABC_FREE( p->vCis.pArray );
    ABC_FREE( p->vCos.pArray );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}